

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O1

ON_XMLNode * __thiscall ON_Displacement::AddChildXML(ON_Displacement *this,ON_XMLRootNode *root)

{
  CImplDSP *pCVar1;
  int iVar2;
  CImpl *in_RAX;
  ON_XMLNode *pOVar3;
  ON_XMLNode *pOVar4;
  undefined4 extraout_var;
  SubItem *pSVar5;
  SubItemIterator it;
  SubItemIterator local_28;
  
  local_28.m_impl = in_RAX;
  pOVar3 = ON_MeshModifier::AddChildXML(&this->super_ON_MeshModifier,root);
  if (pOVar3 != (ON_XMLNode *)0x0) {
    SubItemIterator::SubItemIterator(&local_28,this);
    while( true ) {
      iVar2 = (local_28.m_impl)->m_index;
      pCVar1 = (local_28.m_impl)->m_dsp->m_impl_dsp;
      if (iVar2 < (pCVar1->m_subs).m_count) {
        (local_28.m_impl)->m_index = iVar2 + 1;
        pSVar5 = (pCVar1->m_subs).m_a[iVar2];
      }
      else {
        pSVar5 = (SubItem *)0x0;
      }
      if (pSVar5 == (SubItem *)0x0) break;
      pOVar4 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(pOVar4,L"");
      iVar2 = (*pOVar3->_vptr_ON_XMLNode[0xb])(pOVar3,pOVar4);
      pOVar4 = ON_InternalXMLImpl::Node(&pSVar5->m_impl->super_ON_InternalXMLImpl);
      ON_XMLNode::operator=((ON_XMLNode *)CONCAT44(extraout_var,iVar2),pOVar4);
    }
    SubItemIterator::~SubItemIterator(&local_28);
  }
  return pOVar3;
}

Assistant:

ON_XMLNode* ON_Displacement::AddChildXML(ON_XMLRootNode& root) const
{
  ON_XMLNode* dsp_node = ON_MeshModifier::AddChildXML(root);
  if (nullptr != dsp_node)
  {
    auto it = GetSubItemIterator();
    SubItem* sub_item = nullptr;
    while (nullptr != (sub_item = it.Next()))
    {
      ON_XMLNode* sub_node = dsp_node->AttachChildNode(new ON_XMLNode(L""));
      sub_item->ToXML(*sub_node);
    }
  }

  return dsp_node;
}